

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

_Bool Curl_host_is_ipnum(char *hostname)

{
  bool bVar1;
  int iVar2;
  in_addr in;
  in6_addr in6;
  undefined1 local_1c [4];
  undefined1 local_18 [16];
  
  iVar2 = inet_pton(2,hostname,local_1c);
  bVar1 = true;
  if (iVar2 < 1) {
    iVar2 = inet_pton(10,hostname,local_18);
    bVar1 = 0 < iVar2;
  }
  return bVar1;
}

Assistant:

bool Curl_host_is_ipnum(const char *hostname)
{
  struct in_addr in;
#ifdef ENABLE_IPV6
  struct in6_addr in6;
#endif
  if(Curl_inet_pton(AF_INET, hostname, &in) > 0
#ifdef ENABLE_IPV6
     || Curl_inet_pton(AF_INET6, hostname, &in6) > 0
#endif
    )
    return TRUE;
  return FALSE;
}